

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int xfer_upload_gotpkt(fxp_xfer *xfer,sftp_packet *pktin)

{
  void *ptr;
  req *prVar1;
  req *prVar2;
  _Bool _Var3;
  uint uVar4;
  sftp_request *req;
  req **pprVar5;
  
  req = sftp_find_request(pktin);
  uVar4 = 0x80000000;
  if (req != (sftp_request *)0x0) {
    ptr = req->userdata;
    if (ptr == (void *)0x0) {
      fxp_error_message = "request ID is not part of the current upload";
      fxp_errtype = -1;
    }
    else {
      _Var3 = fxp_write_recv(pktin,req);
      prVar1 = *(req **)((long)ptr + 0x28);
      pprVar5 = &prVar1->next;
      if (prVar1 == (req *)0x0) {
        pprVar5 = &xfer->head;
      }
      prVar2 = *(req **)((long)ptr + 0x20);
      *pprVar5 = prVar2;
      pprVar5 = &prVar2->prev;
      if (prVar2 == (req *)0x0) {
        pprVar5 = &xfer->tail;
      }
      *pprVar5 = prVar1;
      xfer->req_totalsize = xfer->req_totalsize - *(int *)((long)ptr + 8);
      safefree(ptr);
      uVar4 = _Var3 - 1 | 1;
    }
  }
  return uVar4;
}

Assistant:

int xfer_upload_gotpkt(struct fxp_xfer *xfer, struct sftp_packet *pktin)
{
    struct sftp_request *rreq;
    struct req *rr, *prev, *next;
    bool ret;

    rreq = sftp_find_request(pktin);
    if (!rreq)
        return INT_MIN;            /* this packet doesn't even make sense */
    rr = (struct req *)fxp_get_userdata(rreq);
    if (!rr) {
        fxp_internal_error("request ID is not part of the current upload");
        return INT_MIN;                /* this packet isn't ours */
    }
    ret = fxp_write_recv(pktin, rreq);
#ifdef DEBUG_UPLOAD
    printf("write request %p has returned [%d]\n", rr, ret ? 1 : 0);
#endif

    /*
     * Remove this one from the queue.
     */
    prev = rr->prev;
    next = rr->next;
    if (prev)
        prev->next = next;
    else
        xfer->head = next;
    if (next)
        next->prev = prev;
    else
        xfer->tail = prev;
    xfer->req_totalsize -= rr->len;
    sfree(rr);

    if (!ret)
        return -1;

    return 1;
}